

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

QByteArray * makeCacheKey(QUrl *url,QNetworkProxy *proxy,QString *peerVerifyName)

{
  bool bVar1;
  byte bVar2;
  ProxyType PVar3;
  long in_RDX;
  QUrl *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringBuilder<char16_t,_const_QString_&> QVar5;
  bool isLocalSocket;
  bool isEncrypted;
  QByteArray obfuscatedPassword;
  QUrl key;
  QString scheme;
  QUrl copy;
  QString result;
  QString *in_stack_fffffffffffffcf8;
  QStringBuilder<const_char_(&)[17],_QByteArray> *this;
  QLatin1StringView *in_stack_fffffffffffffd00;
  QByteArray *b;
  QString *in_stack_fffffffffffffd08;
  char (*a) [17];
  undefined4 in_stack_fffffffffffffd10;
  uint uVar6;
  undefined4 in_stack_fffffffffffffd14;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 uVar7;
  QString *a_00;
  QLatin1StringView in_stack_fffffffffffffd30;
  QByteArray local_250;
  QStringBuilder<const_char_(&)[17],_QByteArray> local_238;
  undefined2 local_212;
  char16_t local_210;
  QString *local_208;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_1fc;
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [72];
  Algorithm local_168;
  undefined1 local_158 [24];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  QUrl local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [48];
  QLatin1StringView local_98;
  QLatin1StringView local_70;
  QLatin1StringView local_60;
  QLatin1StringView local_50;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  QUrl local_28;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[0] = -0x56;
  local_20[1] = -0x56;
  local_20[2] = -0x56;
  local_20[3] = -0x56;
  local_20[4] = -0x56;
  local_20[5] = -0x56;
  local_20[6] = -0x56;
  local_20[7] = -0x56;
  local_20[8] = -0x56;
  local_20[9] = -0x56;
  local_20[10] = -0x56;
  local_20[0xb] = -0x56;
  local_20[0xc] = -0x56;
  local_20[0xd] = -0x56;
  local_20[0xe] = -0x56;
  local_20[0xf] = -0x56;
  local_20[0x10] = -0x56;
  local_20[0x11] = -0x56;
  local_20[0x12] = -0x56;
  local_20[0x13] = -0x56;
  local_20[0x14] = -0x56;
  local_20[0x15] = -0x56;
  local_20[0x16] = -0x56;
  local_20[0x17] = -0x56;
  QString::QString((QString *)0x30e79f);
  local_28.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_28,in_RSI);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QUrl::scheme();
  local_50 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
  bVar1 = operator==(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  uVar7 = true;
  if (!bVar1) {
    local_60 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
    uVar7 = operator==(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  }
  QVar4 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
  bVar2 = QString::startsWith((QLatin1String *)&local_40,(CaseSensitivity)QVar4.m_size);
  if ((bVar2 & 1) == 0) {
    QUrl::port((int)&local_28);
    QUrl::setPort((int)&local_28);
  }
  local_70 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
  bVar1 = operator==(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd30);
    QUrl::setScheme((QString *)&local_28);
    QString::~QString((QString *)0x30e9a8);
  }
  else {
    local_98 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
    bVar1 = operator==(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd30);
      QUrl::setScheme((QString *)&local_28);
      QString::~QString((QString *)0x30ea3d);
    }
  }
  local_d4 = (int)operator|((UrlFormattingOption)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                            (UrlFormattingOption)in_stack_fffffffffffffd00);
  local_d0 = (int)QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                  operator|((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                             *)in_stack_fffffffffffffd00,
                            (UrlFormattingOption)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  local_cc = (int)QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                  operator|((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>
                             *)in_stack_fffffffffffffd00,
                            (UrlFormattingOption)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
            ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
             in_stack_fffffffffffffd00,
             (ComponentFormattingOption)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  QUrl::toString((QUrlTwoFlags_conflict1 *)local_c8);
  QString::operator=((QString *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  QString::~QString((QString *)0x30ead8);
  a_00 = (QString *)in_stack_fffffffffffffd30.m_size;
  if (in_RDX != 0) {
    PVar3 = QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffd00);
    a_00 = (QString *)in_stack_fffffffffffffd30.m_size;
    if (PVar3 != NoProxy) {
      local_e0.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
      QUrl::QUrl(&local_e0);
      PVar3 = QNetworkProxy::type((QNetworkProxy *)in_stack_fffffffffffffd00);
      a_00 = (QString *)in_stack_fffffffffffffd30.m_size;
      if (PVar3 == Socks5Proxy) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
        a_00 = (QString *)in_stack_fffffffffffffd30.m_size;
        QString::QString((QString *)CONCAT44(PVar3,in_stack_fffffffffffffd10),
                         in_stack_fffffffffffffd30);
        QUrl::setScheme((QString *)&local_e0);
        QString::~QString((QString *)0x30eb9b);
      }
      else if (PVar3 - HttpProxy < 2) {
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffd08,(size_t)in_stack_fffffffffffffd00);
        a_00 = (QString *)QVar4.m_size;
        QString::QString((QString *)CONCAT44(PVar3,in_stack_fffffffffffffd10),QVar4);
        QUrl::setScheme((QString *)&local_e0);
        QString::~QString((QString *)0x30ebf1);
      }
      QUrl::scheme();
      bVar1 = QString::isEmpty((QString *)0x30ec17);
      uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd10) ^ 0xff000000;
      QString::~QString((QString *)0x30ec2a);
      if ((uVar6 & 0x1000000) != 0) {
        local_140 = 0xaaaaaaaaaaaaaaaa;
        local_138 = 0xaaaaaaaaaaaaaaaa;
        local_130 = 0xaaaaaaaaaaaaaaaa;
        QNetworkProxy::password((QNetworkProxy *)in_stack_fffffffffffffd08);
        QString::toUtf8(in_stack_fffffffffffffcf8);
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  ((QByteArrayView *)CONCAT44(PVar3,uVar6),(QByteArray *)in_stack_fffffffffffffd08);
        QCryptographicHash::hash((QByteArrayView *)local_158,local_168);
        QByteArray::toHex((char)&local_140);
        QByteArray::~QByteArray((QByteArray *)0x30ece9);
        QByteArray::~QByteArray((QByteArray *)0x30ecf6);
        QString::~QString((QString *)0x30ed03);
        QNetworkProxy::user((QNetworkProxy *)in_stack_fffffffffffffd08);
        QUrl::setUserName((QString *)&local_e0,(ParsingMode)local_1b0);
        QString::~QString((QString *)0x30ed3f);
        QString::fromUtf8<void>((QByteArray *)in_stack_fffffffffffffd00);
        QUrl::setPassword((QString *)&local_e0,(ParsingMode)local_1c8);
        QString::~QString((QString *)0x30ed7b);
        QNetworkProxy::hostName((QNetworkProxy *)in_stack_fffffffffffffd08);
        QUrl::setHost((QString *)&local_e0,(ParsingMode)local_1e0);
        QString::~QString((QString *)0x30edb7);
        QNetworkProxy::port((QNetworkProxy *)in_stack_fffffffffffffd00);
        QUrl::setPort((int)&local_e0);
        QUrl::setQuery((QString *)&local_e0,(ParsingMode)local_20);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (&local_1fc,FullyEncoded);
        QUrl::toString((QUrlTwoFlags_conflict1 *)local_1f8);
        QString::operator=((QString *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        QString::~QString((QString *)0x30ee3b);
        QByteArray::~QByteArray((QByteArray *)0x30ee48);
      }
      QUrl::~QUrl(&local_e0);
    }
  }
  bVar1 = QString::isEmpty((QString *)0x30ee62);
  if (!bVar1) {
    local_212 = 0x3a;
    QVar5 = operator+((char16_t *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_208 = QVar5.b;
    local_210 = QVar5.a;
    operator+=(a_00,(QStringBuilder<char16_t,_const_QString_&> *)
                    CONCAT17(uVar7,in_stack_fffffffffffffd28));
  }
  b = &local_250;
  a = (char (*) [17])local_20;
  QString::toLatin1(in_stack_fffffffffffffcf8);
  this = &local_238;
  operator+(a,b);
  QStringBuilder::operator_cast_to_QByteArray(this);
  QStringBuilder<const_char_(&)[17],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[17],_QByteArray> *)0x30eefd);
  QByteArray::~QByteArray((QByteArray *)0x30ef07);
  QString::~QString((QString *)0x30ef14);
  QUrl::~QUrl(&local_28);
  QString::~QString((QString *)0x30ef2b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray makeCacheKey(QUrl &url, QNetworkProxy *proxy, const QString &peerVerifyName)
{
    QString result;
    QUrl copy = url;
    QString scheme = copy.scheme();
    bool isEncrypted = scheme == "https"_L1 || scheme == "preconnect-https"_L1;
    const bool isLocalSocket = scheme.startsWith("unix"_L1);
    if (!isLocalSocket)
        copy.setPort(copy.port(isEncrypted ? 443 : 80));
    if (scheme == "preconnect-http"_L1)
        copy.setScheme("http"_L1);
    else if (scheme == "preconnect-https"_L1)
        copy.setScheme("https"_L1);
    result = copy.toString(QUrl::RemoveUserInfo | QUrl::RemovePath |
                           QUrl::RemoveQuery | QUrl::RemoveFragment | QUrl::FullyEncoded);

#ifndef QT_NO_NETWORKPROXY
    if (proxy && proxy->type() != QNetworkProxy::NoProxy) {
        QUrl key;

        switch (proxy->type()) {
        case QNetworkProxy::Socks5Proxy:
            key.setScheme("proxy-socks5"_L1);
            break;

        case QNetworkProxy::HttpProxy:
        case QNetworkProxy::HttpCachingProxy:
            key.setScheme("proxy-http"_L1);
            break;

        default:
            break;
        }

        if (!key.scheme().isEmpty()) {
            const QByteArray obfuscatedPassword = QCryptographicHash::hash(proxy->password().toUtf8(),
                                                                           QCryptographicHash::Sha1).toHex();
            key.setUserName(proxy->user());
            key.setPassword(QString::fromUtf8(obfuscatedPassword));
            key.setHost(proxy->hostName());
            key.setPort(proxy->port());
            key.setQuery(result);
            result = key.toString(QUrl::FullyEncoded);
        }
    }
#else
    Q_UNUSED(proxy);
#endif
    if (!peerVerifyName.isEmpty())
        result += u':' + peerVerifyName;
    return "http-connection:" + std::move(result).toLatin1();
}